

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * Path::enforce_protocol(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_40 [2];
  long local_30 [2];
  
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)path,0x3ac2f2,0);
    if (lVar2 == -1) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"file://","");
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_40,(ulong)(path->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string enforce_protocol(const string &path)
{
	if (path.empty())
		return "";

	auto index = path.find("://");
	if (index == string::npos)
		return string("file://") + path;
	else
		return path;
}